

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall
adios2::query::Worker::GetResultCoverage
          (Worker *this,Box<adios2::Dims> *outputRegion,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks)

{
  bool bVar1;
  iterator __position;
  iterator __first;
  iterator __last;
  Box<adios2::Dims> *in_RDX;
  long in_RDI;
  BlockHit blk;
  iterator __end3;
  iterator __begin3;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *__range3;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> blockHits;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
  *in_stack_fffffffffffffe78;
  Box<adios2::Dims> *in_stack_fffffffffffffe80;
  QueryBase *in_stack_fffffffffffffe88;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *this_00;
  BlockHit *in_stack_fffffffffffffe98;
  BlockHit *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_110;
  BlockHit *local_f8;
  __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
  local_f0;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *local_e8;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_e0;
  undefined1 local_c1 [40];
  undefined1 local_99 [40];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Box<adios2::Dims> *local_18;
  
  local_18 = in_RDX;
  std::
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *)0xd3f9f9);
  bVar1 = QueryBase::UseOutputRegion(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Toolkit",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"query::Worker",&local_71);
    in_stack_fffffffffffffea0 = (BlockHit *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),"GetResultCoverage",(allocator *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe98 = (BlockHit *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_c1 + 1),"Unable to use the output region",
               (allocator *)in_stack_fffffffffffffe98);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0._M_current >> 0x20))
    ;
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if ((*(long *)(in_RDI + 0x30) != 0) && (*(long *)(in_RDI + 0x28) != 0)) {
    this_00 = &local_e0;
    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::vector
              ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)0xd3fc76
              );
    (**(code **)(**(long **)(in_RDI + 0x30) + 0x20))
              (*(long **)(in_RDI + 0x30),*(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28),
               *(long *)(in_RDI + 0x28),this_00);
    local_e8 = &local_e0;
    local_f0._M_current =
         (BlockHit *)
         std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::begin
                   (in_stack_fffffffffffffe78);
    local_f8 = (BlockHit *)
               std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::end
                         (in_stack_fffffffffffffe78);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
      ::operator*(&local_f0);
      BlockHit::BlockHit(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_stack_fffffffffffffe80 = local_18;
      __position = std::
                   vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::end((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffe78);
      __gnu_cxx::
      __normal_iterator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>const*,std::vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
      ::
      __normal_iterator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>*>
                ((__normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)in_stack_fffffffffffffe80,
                 (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe78 = &local_110;
      __first = std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::begin((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_stack_fffffffffffffe78);
      __last = std::
               vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::end((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffec0 =
           std::
           vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
           ::
           insert<__gnu_cxx::__normal_iterator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,void>
                     (in_stack_fffffffffffffec0._M_current,__position._M_current,__first._M_current,
                      __last._M_current);
      BlockHit::~BlockHit((BlockHit *)0xd3fd86);
      __gnu_cxx::
      __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
      ::operator++(&local_f0);
    }
    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector(this_00)
    ;
  }
  return;
}

Assistant:

void Worker::GetResultCoverage(const adios2::Box<adios2::Dims> &outputRegion,
                               std::vector<Box<Dims>> &touchedBlocks)
{
    touchedBlocks.clear();

    if (!m_Query->UseOutputRegion(outputRegion))
    {
        helper::Throw<std::invalid_argument>("Toolkit", "query::Worker", "GetResultCoverage",
                                             "Unable to use the output region");
    }

    if (m_Query && m_SourceReader)
    {
        std::vector<BlockHit> blockHits;
        m_Query->BlockIndexEvaluate(m_SourceReader->m_IO, *m_SourceReader, blockHits);

        for (auto blk : blockHits)
            touchedBlocks.insert(touchedBlocks.end(), blk.m_Regions.begin(), blk.m_Regions.end());
    }
}